

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<ki::protocol::net::Session,_PySession> * __thiscall
pybind11::class_<ki::protocol::net::Session,PySession>::
def<void(ki::protocol::net::Session::*)(char_const*,unsigned_long),pybind11::arg,pybind11::arg>
          (class_<ki::protocol::net::Session,PySession> *this,char *name_,
          offset_in_Message_to_subr *f,arg *extra,arg *extra_1)

{
  offset_in_Message_to_subr f_00;
  name *extra_00;
  handle local_70;
  cpp_function cf;
  handle local_60;
  object local_58;
  char *local_50 [4];
  PyObject *local_30;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_70.m_ptr = *(PyObject **)this;
  local_58.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50[0] = name_;
  getattr((pybind11 *)&local_60,local_70,name_,(PyObject *)&_Py_NoneStruct);
  local_30 = local_60.m_ptr;
  cpp_function::
  cpp_function<void,ki::protocol::net::Session,char_const*,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&cf,f_00,extra_00,(is_method *)local_50,(sibling *)&local_70,(arg *)&local_30,extra);
  object::~object((object *)&local_60);
  object::~object(&local_58);
  cpp_function::name((cpp_function *)&local_70);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_50,(object_api<pybind11::handle> *)this,local_70);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_50,&cf);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_50);
  object::~object((object *)&local_70);
  object::~object((object *)&cf);
  return (class_<ki::protocol::net::Session,_PySession> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }